

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::FreeColSingletonPS(FreeColSingletonPS *this,FreeColSingletonPS *old)

{
  long in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffffc0;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffffc0,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__FreeColSingletonPS_0089d7b0;
  (in_RDI->data)._M_elems[10] = *(uint *)(in_RSI + 0x28);
  (in_RDI->data)._M_elems[0xb] = *(uint *)(in_RSI + 0x2c);
  (in_RDI->data)._M_elems[0xc] = *(uint *)(in_RSI + 0x30);
  (in_RDI->data)._M_elems[0xd] = *(uint *)(in_RSI + 0x34);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffc0,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffc0,in_RDI);
  *(byte *)(in_RDI[2].data._M_elems + 0xe) = *(byte *)(in_RSI + 0xd8) & 1;
  *(byte *)((long)in_RDI[2].data._M_elems + 0x39) = *(byte *)(in_RSI + 0xd9) & 1;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffc0,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
  return;
}

Assistant:

FreeColSingletonPS(const FreeColSingletonPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_obj(old.m_obj)
         , m_lRhs(old.m_lRhs)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
      {}